

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fLayoutBindingTests.cpp
# Opt level: O0

string * deqp::gles31::Functional::anon_unknown_1::generateTessControlShader
                   (string *__return_storage_ptr__,ShaderType shaderType,
                   string *shaderUniformDeclarations,string *shaderBody)

{
  ostream *poVar1;
  allocator<char> local_1b9;
  ostringstream local_1b8 [8];
  ostringstream tessControlShaderSource;
  allocator<char> local_29;
  string *local_28;
  string *shaderBody_local;
  string *shaderUniformDeclarations_local;
  string *psStack_10;
  ShaderType shaderType_local;
  
  local_28 = shaderBody;
  shaderBody_local = shaderUniformDeclarations;
  shaderUniformDeclarations_local._4_4_ = shaderType;
  psStack_10 = __return_storage_ptr__;
  if (shaderType < SHADERTYPE_TESS_CONTROL) {
LAB_0070e615:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,
               "#version 310 es\n#extension GL_EXT_tessellation_shader : require\nlayout (vertices=3) out;\n\nvoid main (void)\n{\n\tgl_out[gl_InvocationID].gl_Position = gl_in[gl_InvocationID].gl_Position;\n}\n"
               ,&local_29);
    std::allocator<char>::~allocator(&local_29);
  }
  else {
    if (shaderType != SHADERTYPE_TESS_CONTROL) {
      if (shaderType == SHADERTYPE_TESS_EVALUATION) goto LAB_0070e615;
      if (shaderType != SHADERTYPE_ALL) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,"",&local_1b9);
        std::allocator<char>::~allocator(&local_1b9);
        return __return_storage_ptr__;
      }
    }
    std::__cxx11::ostringstream::ostringstream(local_1b8);
    poVar1 = std::operator<<((ostream *)local_1b8,"#version 310 es\n");
    poVar1 = std::operator<<(poVar1,"#extension GL_EXT_tessellation_shader : require\n");
    poVar1 = std::operator<<(poVar1,"layout (vertices=3) out;\n");
    poVar1 = std::operator<<(poVar1,"\n");
    poVar1 = std::operator<<(poVar1,"uniform highp int u_arrayNdx;\n\n");
    poVar1 = std::operator<<(poVar1,(string *)shaderBody_local);
    poVar1 = std::operator<<(poVar1,"\n");
    poVar1 = std::operator<<(poVar1,"void main (void)\n");
    poVar1 = std::operator<<(poVar1,"{\n");
    poVar1 = std::operator<<(poVar1,"\thighp vec4 color;\n\n");
    poVar1 = std::operator<<(poVar1,(string *)local_28);
    poVar1 = std::operator<<(poVar1,"\n");
    poVar1 = std::operator<<(poVar1,
                             "\tgl_out[gl_InvocationID].gl_Position = gl_in[gl_InvocationID].gl_Position;\n"
                            );
    std::operator<<(poVar1,"}\n");
    std::__cxx11::ostringstream::str();
    std::__cxx11::ostringstream::~ostringstream(local_1b8);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string generateTessControlShader (ShaderType shaderType, const std::string& shaderUniformDeclarations, const std::string& shaderBody)
{
	static const char* const s_simpleTessContorlShaderSource =	"#version 310 es\n"
																"#extension GL_EXT_tessellation_shader : require\n"
																"layout (vertices=3) out;\n"
																"\n"
																"void main (void)\n"
																"{\n"
																"	gl_out[gl_InvocationID].gl_Position = gl_in[gl_InvocationID].gl_Position;\n"
																"}\n";

	switch (shaderType)
	{
		case SHADERTYPE_VERTEX:
		case SHADERTYPE_FRAGMENT:
		case SHADERTYPE_TESS_EVALUATION:
			return s_simpleTessContorlShaderSource;

		case SHADERTYPE_TESS_CONTROL:
		case SHADERTYPE_ALL:
		{
			std::ostringstream tessControlShaderSource;
			tessControlShaderSource <<	"#version 310 es\n"
									<<	"#extension GL_EXT_tessellation_shader : require\n"
									<<	"layout (vertices=3) out;\n"
									<<	"\n"
									<<	"uniform highp int u_arrayNdx;\n\n"
									<<	shaderUniformDeclarations << "\n"
									<<	"void main (void)\n"
									<<	"{\n"
									<<	"	highp vec4 color;\n\n"
									<<	shaderBody << "\n"
									<<	"	gl_out[gl_InvocationID].gl_Position = gl_in[gl_InvocationID].gl_Position;\n"
									<<	"}\n";

			return tessControlShaderSource.str();
		}

		default:
			DE_ASSERT(false);
			return "";
	}
}